

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcCom.c
# Opt level: O0

int Abc_CommandBlastMem(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Wlc_Ntk_t *pWVar3;
  char *pcVar4;
  int fVerbose;
  int c;
  Wlc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pWVar3 = Wlc_AbcGetNtk(pAbc);
  bVar1 = false;
  Extra_UtilGetoptReset();
  while( true ) {
    iVar2 = Extra_UtilGetopt(argc,argv,"vh");
    if (iVar2 == -1) {
      if (pWVar3 == (Wlc_Ntk_t *)0x0) {
        Abc_Print(1,"Abc_CommandBlastMem(): There is no current design.\n");
      }
      else {
        pWVar3 = Wlc_NtkMemBlast(pWVar3);
        Wlc_AbcUpdateNtk(pAbc,pWVar3);
      }
      return 0;
    }
    if ((iVar2 == 0x68) || (iVar2 != 0x76)) break;
    bVar1 = (bool)(bVar1 ^ 1);
  }
  Abc_Print(-2,"usage: %%blastmem [-vh]\n");
  Abc_Print(-2,"\t         performs blasting of memory read/write ports\n");
  pcVar4 = "no";
  if (bVar1) {
    pcVar4 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandBlastMem( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Wlc_Ntk_t * Wlc_NtkMemBlast( Wlc_Ntk_t * p );
    Wlc_Ntk_t * pNtk = Wlc_AbcGetNtk(pAbc);
    int c, fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( 1, "Abc_CommandBlastMem(): There is no current design.\n" );
        return 0;
    }
    pNtk = Wlc_NtkMemBlast( pNtk );
    Wlc_AbcUpdateNtk( pAbc, pNtk );
    return 0;
usage:
    Abc_Print( -2, "usage: %%blastmem [-vh]\n" );
    Abc_Print( -2, "\t         performs blasting of memory read/write ports\n" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}